

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_verify_traces.c
# Opt level: O3

int main(int argc,char **argv)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  parasail_sequences_t *sequences;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  int *piVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  void *__ptr;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long *extraout_RDX;
  int iVar14;
  long lVar15;
  uint *puVar16;
  ulong uVar17;
  char **__endptr;
  long lVar18;
  gap_score_t *pgVar19;
  long in_R8;
  undefined8 in_R9;
  long lVar20;
  int *unaff_R12;
  unsigned_long pair_limit_;
  long lVar21;
  ulong uVar22;
  gap_score_t gVar23;
  ulong uVar24;
  parasail_matrix_t **pppVar25;
  long lVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  parasail_function_group_t f;
  parasail_function_group_t f_00;
  parasail_function_group_t f_01;
  parasail_function_group_t f_02;
  parasail_function_group_t f_03;
  parasail_function_group_t f_04;
  parasail_function_group_t f_05;
  parasail_function_group_t f_06;
  parasail_function_group_t f_07;
  parasail_function_group_t f_08;
  parasail_function_group_t f_09;
  parasail_function_group_t f_10;
  parasail_function_group_t f_11;
  parasail_function_group_t f_12;
  parasail_function_group_t f_13;
  parasail_function_group_t f_14;
  parasail_function_group_t f_15;
  parasail_function_group_t f_16;
  parasail_function_group_t f_17;
  parasail_function_group_t f_18;
  parasail_function_group_t f_19;
  parasail_function_group_t f_20;
  parasail_function_group_t f_21;
  parasail_function_group_t f_22;
  parasail_function_group_t f_23;
  parasail_function_group_t f_24;
  parasail_function_group_t f_25;
  parasail_function_group_t f_26;
  parasail_function_group_t f_27;
  parasail_function_group_t f_28;
  parasail_function_group_t f_29;
  parasail_function_group_t f_30;
  parasail_function_group_t f_31;
  parasail_function_group_t f_32;
  parasail_function_group_t f_33;
  parasail_function_group_t f_34;
  parasail_function_group_t f_35;
  parasail_function_group_t f_36;
  parasail_function_group_t f_37;
  parasail_function_group_t f_38;
  parasail_function_group_t f_39;
  parasail_function_group_t f_40;
  parasail_function_group_t f_41;
  parasail_function_group_t f_42;
  parasail_function_group_t f_43;
  parasail_function_group_t f_44;
  parasail_function_group_t f_45;
  parasail_function_group_t f_46;
  parasail_function_group_t f_47;
  parasail_function_group_t f_48;
  parasail_function_group_t f_49;
  parasail_function_group_t f_50;
  char *endptr;
  uint uStack_178;
  uint uStack_174;
  char **ppcStack_170;
  parasail_matrix_t *ppStack_d0;
  undefined8 uStack_c8;
  ulong uStack_b8;
  int *piStack_b0;
  ulong uStack_a8;
  char *pcStack_a0;
  char **ppcStack_98;
  code *pcStack_90;
  uint local_7c;
  uint local_78;
  uint local_74;
  char *local_70;
  long local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  char *local_50;
  int *local_48;
  int *local_40;
  uint *local_38;
  
  local_50 = (char *)0x0;
  local_68 = 0x80000000;
  local_38 = (uint *)0x0;
  local_40 = (int *)0x0;
  local_48 = (int *)0x0;
  local_70 = (char *)0x80000000;
  local_60 = 1;
  local_5c = 1;
  local_58 = 1;
  local_54 = 1;
  local_7c = 1;
  local_78 = 1;
  local_74 = 1;
  uVar12 = 1;
LAB_0012f447:
  while( true ) {
    uVar17 = uVar12;
    pcStack_90 = (code *)0x12f457;
    uVar12 = uVar17;
    __endptr = argv;
    iVar2 = getopt(argc,argv,"f:m:n:o:e:vSi:E");
    puVar16 = local_38;
    pcVar4 = local_70;
    piVar6 = _optarg;
    iVar14 = (int)uVar17;
    if (0x52 < iVar2) break;
    if (iVar2 != 0x45) {
      if (iVar2 != -1) {
        if (iVar2 == 0x3f) {
          pcStack_90 = (code *)0x12fecf;
          main_cold_1();
        }
        goto switchD_0012f46c_caseD_2;
      }
      if (local_40 != (int *)0x0) {
        pcStack_90 = (code *)0x12f679;
        sequences = (parasail_sequences_t *)parasail_sequences_from_file();
        if (puVar16 == (uint *)0x0) {
          puVar16 = (uint *)sequences->l;
        }
        if (local_48 != (int *)0x0) {
          pcStack_90 = (code *)0x12f694;
          ppVar5 = (parasail_matrix_t *)parasail_matrix_lookup();
          if (ppVar5 != (parasail_matrix_t *)0x0) goto LAB_0012f6a4;
          pcStack_90 = (code *)0x12f6a1;
          main_cold_5();
        }
        ppVar5 = (parasail_matrix_t *)0x0;
LAB_0012f6a4:
        pair_limit_ = 0;
        if ((uint *)0x1 < puVar16) {
          pair_limit_ = (ulong)(((long)puVar16 + -1) * (long)puVar16) >> 1;
        }
        pcStack_90 = (code *)0x12f6d1;
        printf("%lu choose 2 is %lu\n",puVar16,pair_limit_);
        if (local_60 != 0) {
          pcStack_90 = (code *)0x12f6e3;
          iVar2 = parasail_can_use_sse2();
          if (iVar14 != 0 && iVar2 != 0) {
            uVar12 = (ulong)pcVar4 & 0xffffffff;
            if (local_7c != 0) {
              pcStack_90 = (code *)0x12f72b;
              f.fs = parasail_nw_trace_sse2_functions;
              f.name = "parasail_nw_trace_sse2";
              check_functions(f,sequences,pair_limit_,ppVar5,
                              (gap_score_t)((local_68 << 0x20) + uVar12));
            }
            if (local_78 != 0) {
              gVar23 = (gap_score_t)((local_68 << 0x20) + uVar12);
              pcStack_90 = (code *)0x12f762;
              f_00.fs = parasail_sg_trace_sse2_functions;
              f_00.name = "parasail_sg_trace_sse2";
              check_functions(f_00,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f781;
              f_01.fs = parasail_sg_qb_trace_sse2_functions;
              f_01.name = "parasail_sg_qb_trace_sse2";
              check_functions(f_01,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f7a0;
              f_02.fs = parasail_sg_qe_trace_sse2_functions;
              f_02.name = "parasail_sg_qe_trace_sse2";
              check_functions(f_02,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f7bf;
              f_03.fs = parasail_sg_qx_trace_sse2_functions;
              f_03.name = "parasail_sg_qx_trace_sse2";
              check_functions(f_03,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f7de;
              f_04.fs = parasail_sg_db_trace_sse2_functions;
              f_04.name = "parasail_sg_db_trace_sse2";
              check_functions(f_04,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f7fd;
              f_05.fs = parasail_sg_de_trace_sse2_functions;
              f_05.name = "parasail_sg_de_trace_sse2";
              check_functions(f_05,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f81c;
              f_06.fs = parasail_sg_dx_trace_sse2_functions;
              f_06.name = "parasail_sg_dx_trace_sse2";
              check_functions(f_06,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f83b;
              f_07.fs = parasail_sg_qb_de_trace_sse2_functions;
              f_07.name = "parasail_sg_qb_de_trace_sse2";
              check_functions(f_07,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f85a;
              f_08.fs = parasail_sg_qe_db_trace_sse2_functions;
              f_08.name = "parasail_sg_qe_db_trace_sse2";
              check_functions(f_08,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f879;
              f_09.fs = parasail_sg_qb_db_trace_sse2_functions;
              f_09.name = "parasail_sg_qb_db_trace_sse2";
              check_functions(f_09,sequences,pair_limit_,ppVar5,gVar23);
              pcVar4 = local_70;
              pcStack_90 = (code *)0x12f89d;
              f_10.fs = parasail_sg_qe_de_trace_sse2_functions;
              f_10.name = "parasail_sg_qe_de_trace_sse2";
              check_functions(f_10,sequences,pair_limit_,ppVar5,gVar23);
            }
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12f8cf;
              f_11.fs = parasail_sw_trace_sse2_functions;
              f_11.name = "parasail_sw_trace_sse2";
              check_functions(f_11,sequences,pair_limit_,ppVar5,
                              (gap_score_t)(uVar12 | local_68 << 0x20));
            }
          }
        }
        lVar18 = local_68;
        if (local_5c != 0) {
          pcStack_90 = (code *)0x12f8e6;
          iVar2 = parasail_can_use_sse41();
          if (iVar14 != 0 && iVar2 != 0) {
            if (local_7c != 0) {
              pcStack_90 = (code *)0x12f92b;
              f_12.fs = parasail_nw_trace_sse41_functions;
              f_12.name = "parasail_nw_trace_sse41";
              check_functions(f_12,sequences,pair_limit_,ppVar5,
                              (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
            }
            if (local_78 != 0) {
              gVar23 = (gap_score_t)((ulong)local_70 & 0xffffffff | lVar18 << 0x20);
              pcStack_90 = (code *)0x12f964;
              f_13.fs = parasail_sg_trace_sse41_functions;
              f_13.name = "parasail_sg_trace_sse41";
              check_functions(f_13,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f983;
              f_14.fs = parasail_sg_qb_trace_sse41_functions;
              f_14.name = "parasail_sg_qb_trace_sse41";
              check_functions(f_14,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f9a2;
              f_15.fs = parasail_sg_qe_trace_sse41_functions;
              f_15.name = "parasail_sg_qe_trace_sse41";
              check_functions(f_15,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f9c1;
              f_16.fs = parasail_sg_qx_trace_sse41_functions;
              f_16.name = "parasail_sg_qx_trace_sse41";
              check_functions(f_16,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f9e0;
              f_17.fs = parasail_sg_db_trace_sse41_functions;
              f_17.name = "parasail_sg_db_trace_sse41";
              check_functions(f_17,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12f9ff;
              f_18.fs = parasail_sg_de_trace_sse41_functions;
              f_18.name = "parasail_sg_de_trace_sse41";
              check_functions(f_18,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fa1e;
              f_19.fs = parasail_sg_dx_trace_sse41_functions;
              f_19.name = "parasail_sg_dx_trace_sse41";
              check_functions(f_19,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fa3d;
              f_20.fs = parasail_sg_qb_de_trace_sse41_functions;
              f_20.name = "parasail_sg_qb_de_trace_sse41";
              check_functions(f_20,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fa5c;
              f_21.fs = parasail_sg_qe_db_trace_sse41_functions;
              f_21.name = "parasail_sg_qe_db_trace_sse41";
              check_functions(f_21,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fa7b;
              f_22.fs = parasail_sg_qb_db_trace_sse41_functions;
              f_22.name = "parasail_sg_qb_db_trace_sse41";
              check_functions(f_22,sequences,pair_limit_,ppVar5,gVar23);
              pcVar4 = local_70;
              pcStack_90 = (code *)0x12fa9f;
              f_23.fs = parasail_sg_qe_de_trace_sse41_functions;
              f_23.name = "parasail_sg_qe_de_trace_sse41";
              check_functions(f_23,sequences,pair_limit_,ppVar5,gVar23);
            }
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12facf;
              f_24.fs = parasail_sw_trace_sse41_functions;
              f_24.name = "parasail_sw_trace_sse41";
              check_functions(f_24,sequences,pair_limit_,ppVar5,
                              (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
            }
          }
        }
        if (local_58 != 0) {
          pcStack_90 = (code *)0x12fae1;
          iVar2 = parasail_can_use_avx2();
          if (iVar14 != 0 && iVar2 != 0) {
            if (local_7c != 0) {
              pcStack_90 = (code *)0x12fb26;
              f_25.fs = parasail_nw_trace_avx2_functions;
              f_25.name = "parasail_nw_trace_avx2";
              check_functions(f_25,sequences,pair_limit_,ppVar5,
                              (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
            }
            if (local_78 != 0) {
              gVar23 = (gap_score_t)((ulong)local_70 & 0xffffffff | lVar18 << 0x20);
              pcStack_90 = (code *)0x12fb5f;
              f_26.fs = parasail_sg_trace_avx2_functions;
              f_26.name = "parasail_sg_trace_avx2";
              check_functions(f_26,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fb7e;
              f_27.fs = parasail_sg_qb_trace_avx2_functions;
              f_27.name = "parasail_sg_qb_trace_avx2";
              check_functions(f_27,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fb9d;
              f_28.fs = parasail_sg_qe_trace_avx2_functions;
              f_28.name = "parasail_sg_qe_trace_avx2";
              check_functions(f_28,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fbbc;
              f_29.fs = parasail_sg_qx_trace_avx2_functions;
              f_29.name = "parasail_sg_qx_trace_avx2";
              check_functions(f_29,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fbdb;
              f_30.fs = parasail_sg_db_trace_avx2_functions;
              f_30.name = "parasail_sg_db_trace_avx2";
              check_functions(f_30,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fbfa;
              f_31.fs = parasail_sg_de_trace_avx2_functions;
              f_31.name = "parasail_sg_de_trace_avx2";
              check_functions(f_31,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fc19;
              f_32.fs = parasail_sg_dx_trace_avx2_functions;
              f_32.name = "parasail_sg_dx_trace_avx2";
              check_functions(f_32,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fc38;
              f_33.fs = parasail_sg_qb_de_trace_avx2_functions;
              f_33.name = "parasail_sg_qb_de_trace_avx2";
              check_functions(f_33,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fc57;
              f_34.fs = parasail_sg_qe_db_trace_avx2_functions;
              f_34.name = "parasail_sg_qe_db_trace_avx2";
              check_functions(f_34,sequences,pair_limit_,ppVar5,gVar23);
              pcStack_90 = (code *)0x12fc76;
              f_35.fs = parasail_sg_qb_db_trace_avx2_functions;
              f_35.name = "parasail_sg_qb_db_trace_avx2";
              check_functions(f_35,sequences,pair_limit_,ppVar5,gVar23);
              pcVar4 = local_70;
              pcStack_90 = (code *)0x12fc9a;
              f_36.fs = parasail_sg_qe_de_trace_avx2_functions;
              f_36.name = "parasail_sg_qe_de_trace_avx2";
              check_functions(f_36,sequences,pair_limit_,ppVar5,gVar23);
            }
            if (local_74 != 0) {
              pcStack_90 = (code *)0x12fcca;
              f_37.fs = parasail_sw_trace_avx2_functions;
              f_37.name = "parasail_sw_trace_avx2";
              check_functions(f_37,sequences,pair_limit_,ppVar5,
                              (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
            }
          }
        }
        if (iVar14 != 0 && local_54 != 0) {
          if (local_7c != 0) {
            pcStack_90 = (code *)0x12fd12;
            f_38.fs = parasail_nw_trace_disp_functions;
            f_38.name = "parasail_nw_trace_disp";
            check_functions(f_38,sequences,pair_limit_,ppVar5,
                            (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
          }
          if (local_78 != 0) {
            gVar23 = (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20);
            pcStack_90 = (code *)0x12fd49;
            f_39.fs = parasail_sg_trace_disp_functions;
            f_39.name = "parasail_sg_trace_disp";
            check_functions(f_39,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fd68;
            f_40.fs = parasail_sg_qb_trace_disp_functions;
            f_40.name = "parasail_sg_qb_trace_disp";
            check_functions(f_40,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fd87;
            f_41.fs = parasail_sg_qe_trace_disp_functions;
            f_41.name = "parasail_sg_qe_trace_disp";
            check_functions(f_41,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fda6;
            f_42.fs = parasail_sg_qx_trace_disp_functions;
            f_42.name = "parasail_sg_qx_trace_disp";
            check_functions(f_42,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fdc5;
            f_43.fs = parasail_sg_db_trace_disp_functions;
            f_43.name = "parasail_sg_db_trace_disp";
            check_functions(f_43,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fde4;
            f_44.fs = parasail_sg_de_trace_disp_functions;
            f_44.name = "parasail_sg_de_trace_disp";
            check_functions(f_44,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fe03;
            f_45.fs = parasail_sg_dx_trace_disp_functions;
            f_45.name = "parasail_sg_dx_trace_disp";
            check_functions(f_45,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fe22;
            f_46.fs = parasail_sg_qb_de_trace_disp_functions;
            f_46.name = "parasail_sg_qb_de_trace_disp";
            check_functions(f_46,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fe41;
            f_47.fs = parasail_sg_qe_db_trace_disp_functions;
            f_47.name = "parasail_sg_qe_db_trace_disp";
            check_functions(f_47,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fe60;
            f_48.fs = parasail_sg_qb_db_trace_disp_functions;
            f_48.name = "parasail_sg_qb_db_trace_disp";
            check_functions(f_48,sequences,pair_limit_,ppVar5,gVar23);
            pcStack_90 = (code *)0x12fe7f;
            f_49.fs = parasail_sg_qe_de_trace_disp_functions;
            f_49.name = "parasail_sg_qe_de_trace_disp";
            check_functions(f_49,sequences,pair_limit_,ppVar5,gVar23);
          }
          if (local_74 != 0) {
            pcStack_90 = (code *)0x12feac;
            f_50.fs = parasail_sw_trace_disp_functions;
            f_50.name = "parasail_sw_trace_disp";
            check_functions(f_50,sequences,pair_limit_,ppVar5,
                            (gap_score_t)((ulong)pcVar4 & 0xffffffff | lVar18 << 0x20));
          }
        }
        pcStack_90 = (code *)0x12feb4;
        parasail_sequences_free(sequences);
        return 0;
      }
      goto LAB_0012fee3;
    }
    exit_on_mismatch = '\x01';
    uVar12 = uVar17;
  }
  uVar12 = (ulong)(iVar2 - 0x65);
  switch(uVar12) {
  case 0:
    pcStack_90 = (code *)0x12f473;
    unaff_R12 = __errno_location();
    *unaff_R12 = 0;
    __endptr = &local_50;
    pcStack_90 = (code *)0x12f495;
    local_68 = strtol((char *)_optarg,__endptr,10);
    uVar12 = uVar17;
    if (*unaff_R12 != 0) goto LAB_0012fed4;
    goto LAB_0012f447;
  case 1:
    local_40 = _optarg;
    uVar12 = uVar17;
    goto LAB_0012f447;
  case 2:
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0012f46c_caseD_2;
  case 4:
    pcStack_90 = (code *)0x12f59e;
    pcVar4 = strstr((char *)_optarg,"sse2");
    local_60 = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f5b9;
    pcVar4 = strstr((char *)piVar6,"sse41");
    local_5c = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f5d4;
    pcVar4 = strstr((char *)piVar6,"avx2");
    local_58 = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f5ef;
    pcVar4 = strstr((char *)piVar6,"disp");
    local_54 = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f60a;
    pcVar4 = strstr((char *)piVar6,"nw");
    local_7c = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f625;
    pcVar4 = strstr((char *)piVar6,"sg");
    local_78 = (uint)(pcVar4 == (char *)0x0);
    pcStack_90 = (code *)0x12f640;
    pcVar4 = strstr((char *)piVar6,"sw");
    local_74 = (uint)(pcVar4 == (char *)0x0);
    uVar12 = uVar17;
    unaff_R12 = piVar6;
    goto LAB_0012f447;
  case 8:
    local_48 = _optarg;
    uVar12 = uVar17;
    goto LAB_0012f447;
  case 9:
    pcStack_90 = (code *)0x12f54c;
    unaff_R12 = __errno_location();
    *unaff_R12 = 0;
    __endptr = &local_50;
    pcStack_90 = (code *)0x12f56e;
    local_38 = (uint *)strtol((char *)_optarg,__endptr,10);
    uVar12 = uVar17;
    if (*unaff_R12 != 0) goto LAB_0012fede;
    goto LAB_0012f447;
  case 10:
    break;
  default:
    uVar12 = 0;
    if (iVar2 == 0x53) goto LAB_0012f447;
    if (iVar2 == 0x76) {
      verbose = 1;
      uVar12 = uVar17;
      goto LAB_0012f447;
    }
switchD_0012f46c_caseD_2:
    pcStack_90 = (code *)0x12fed4;
    main_cold_7();
LAB_0012fed4:
    pcStack_90 = (code *)0x12fed9;
    main_cold_2();
    goto LAB_0012fed9;
  }
  pcStack_90 = (code *)0x12f50e;
  unaff_R12 = __errno_location();
  *unaff_R12 = 0;
  __endptr = &local_50;
  pcStack_90 = (code *)0x12f530;
  local_70 = (char *)strtol((char *)_optarg,__endptr,10);
  uVar12 = uVar17;
  if (*unaff_R12 != 0) goto LAB_0012fed9;
  goto LAB_0012f447;
LAB_0012fed9:
  pcStack_90 = (code *)0x12fede;
  main_cold_3();
LAB_0012fede:
  pcStack_90 = (code *)0x12fee3;
  main_cold_4();
  puVar16 = &switchD_0012f46c::switchdataD_00131010;
  pcVar4 = "f:m:n:o:e:vSi:E";
LAB_0012fee3:
  pcStack_90 = check_functions;
  main_cold_6();
  uStack_c8 = 0;
  pppVar25 = parasail_matrices;
  if (in_R8 != 0) {
    pppVar25 = &ppStack_d0;
  }
  uStack_b8 = uVar17;
  piStack_b0 = unaff_R12;
  uStack_a8 = (ulong)(uint)argc;
  pcStack_a0 = pcVar4;
  ppcStack_98 = argv;
  pcStack_90 = (code *)puVar16;
  iVar2 = printf("checking %s functions\n");
  ppVar5 = *pppVar25;
  if (ppVar5 == (parasail_matrix_t *)0x0) {
    return iVar2;
  }
  uVar11 = (uint)((ulong)in_R9 >> 0x20);
  uVar17 = CONCAT71((int7)((ulong)(__endptr + 9) >> 8),verbose);
  uVar13 = uVar17 & 0xffffffff;
  lVar18 = 0;
LAB_0012ff9d:
  pcVar4 = ppVar5->name;
  if ((uVar13 & 1) != 0) {
    iVar2 = printf("\t%s\n",pcVar4);
    uVar17 = (ulong)CONCAT31((int3)((uint)iVar2 >> 8),verbose);
  }
  uVar13 = uVar17 & 0xffffffff;
  uVar22 = uVar17 & 0xffffffff;
  pgVar19 = gap_scores;
  lVar27 = 0;
  uVar3 = gap_scores[0].open;
  do {
    uStack_178 = uVar11;
    uStack_174 = (uint)in_R9;
    if (uVar11 == 0x80000000) {
      uStack_178 = pgVar19->extend;
      uStack_174 = uVar3;
    }
    if ((uVar22 & 1) == 0) {
      uVar22 = 0;
    }
    else {
      iVar2 = printf("\t\topen=%d extend=%d ref=%s\n",(ulong)uStack_174,(ulong)uStack_178,
                     __endptr[1]);
      uVar3 = CONCAT31((int3)((uint)iVar2 >> 8),verbose);
      uVar17 = (ulong)uVar3;
      uVar13 = (ulong)uVar3;
      uVar22 = (ulong)uVar3;
    }
    if (__endptr[9] != (char *)0x0) {
      pcVar1 = (code *)*__endptr;
      lVar21 = 1;
      uVar17 = uVar13;
      ppcStack_170 = __endptr + 9;
LAB_0013007b:
      if ((uVar17 & 1) != 0) {
        uVar3 = printf("\t\t\t%s\n",ppcStack_170[1]);
        uVar17 = (ulong)uVar3;
      }
      if (0 < (long)uVar12) {
        lVar20 = 0;
        uVar17 = 0;
LAB_001300a9:
        dVar28 = (double)(long)uVar17;
        dVar29 = dVar28 + dVar28;
        if (dVar29 < 0.0) {
          dVar29 = sqrt(dVar29);
        }
        else {
          dVar29 = SQRT(dVar29);
        }
        dVar30 = floor(dVar29);
        dVar29 = 1.0;
        if (1.0 <= dVar30 + -1.0) {
          dVar29 = dVar30 + -1.0;
        }
        dVar30 = (dVar29 + -1.0) * dVar29 * 0.5;
        for (; dVar31 = dVar28 - dVar30, dVar29 <= dVar31; dVar29 = dVar29 + 1.0) {
          dVar30 = dVar30 + dVar29;
        }
        uVar24 = (long)dVar31 >> 0x3f & (long)(dVar31 - 9.223372036854776e+18) | (long)dVar31;
        uVar22 = (long)dVar29 >> 0x3f & (long)(dVar29 - 9.223372036854776e+18) | (long)dVar29;
        lVar9 = *extraout_RDX;
        lVar15 = uVar24 * 0x40;
        uVar13 = *(ulong *)(lVar9 + 0x20 + lVar15);
        lVar26 = uVar22 * 0x40;
        lVar10 = *(long *)(lVar9 + 0x20 + lVar26);
        if (verbose == 1) {
          printf("\t\t\t\tpair=%lld (%lu,%lu)\n",uVar17,uVar24,uVar22);
          lVar9 = *extraout_RDX;
        }
        piVar6 = (int *)(*pcVar1)(*(undefined8 *)(lVar9 + 0x28 + lVar15),uVar13 & 0xffffffff,
                                  *(undefined8 *)(lVar9 + 0x28 + lVar26),lVar10,uStack_174,
                                  uStack_178,ppVar5);
        piVar7 = (int *)(*(code *)*ppcStack_170)
                                  (*(undefined8 *)(*extraout_RDX + 0x28 + lVar15),
                                   uVar13 & 0xffffffff,
                                   *(undefined8 *)(*extraout_RDX + 0x28 + lVar26),lVar10,uStack_174,
                                   uStack_178,ppVar5);
        iVar2 = parasail_result_is_saturated(piVar7);
        if (iVar2 != 0) {
          parasail_result_free(piVar6);
          uVar8 = parasail_result_free(piVar7);
          lVar20 = lVar20 + 1;
          goto LAB_001303e1;
        }
        lVar9 = parasail_result_get_trace_table(piVar6);
        lVar15 = parasail_result_get_trace_table(piVar7);
        if ((*piVar6 == *piVar7) ||
           (printf("%s(%lu,%lu,%d,%d,%s) wrong score (%d!=%d)\n",ppcStack_170[1],uVar24,uVar22,
                   (ulong)uStack_174,(ulong)uStack_178,pcVar4,*piVar6,*piVar7),
           exit_on_mismatch != '\x01')) {
          lVar26 = lVar10 * uVar13;
          if (((byte)((uint)piVar7[3] >> 0x13) & (piVar7[3] & 0xc00U) != 0) == 0) {
            if (lVar26 != 0) {
              lVar10 = 0;
              do {
                if (*(char *)(lVar9 + lVar10) != *(char *)(lVar15 + lVar10)) goto LAB_0013037b;
                lVar10 = lVar10 + 1;
              } while (lVar26 - lVar10 != 0);
            }
          }
          else {
            __ptr = (void *)parasail_striped_unwind(uVar13 & 0xffffffff,lVar10,piVar7);
            if (lVar26 != 0) {
              lVar10 = 0;
              do {
                if (*(int *)((long)__ptr + lVar10 * 4) != (int)*(char *)(lVar9 + lVar10))
                goto LAB_0013037b;
                lVar10 = lVar10 + 1;
              } while (lVar26 - lVar10 != 0);
            }
            free(__ptr);
          }
          goto LAB_001303bd;
        }
        goto LAB_001304c3;
      }
      goto LAB_0013043e;
    }
LAB_00130469:
    if (uVar11 != 0x80000000) goto LAB_00130490;
    pgVar19 = gap_scores + lVar27 + 1;
    lVar27 = lVar27 + 1;
    uVar3 = pgVar19->open;
  } while( true );
LAB_0013037b:
  printf("%s(%lu,%lu,%d,%d,%s) bad trace table\n",ppcStack_170[1],uVar24,uVar22,(ulong)uStack_174,
         (ulong)uStack_178,pcVar4);
  if (exit_on_mismatch == '\x01') goto LAB_001304c3;
LAB_001303bd:
  parasail_result_free(piVar6);
  uVar8 = parasail_result_free(piVar7);
LAB_001303e1:
  uVar17 = uVar17 + 1;
  if (uVar17 == uVar12) goto code_r0x001303fa;
  goto LAB_001300a9;
code_r0x001303fa:
  uVar17 = CONCAT71((int7)((ulong)uVar8 >> 8),verbose);
  if ((lVar20 != 0 & verbose) == 1) {
    uVar3 = printf("%s %d %d %s saturated %lu times\n",ppcStack_170[1],(ulong)uStack_174,
                   (ulong)uStack_178,pcVar4);
    uVar17 = (ulong)uVar3;
    if (exit_on_mismatch == '\x01') {
LAB_001304c3:
      exit(1);
    }
LAB_0013043e:
    uVar17 = CONCAT71((int7)(uVar17 >> 8),verbose);
  }
  lVar21 = lVar21 + 1;
  ppcStack_170 = __endptr + lVar21 * 9;
  uVar13 = uVar17 & 0xffffffff;
  uVar22 = uVar17 & 0xffffffff;
  if (*ppcStack_170 == (char *)0x0) goto LAB_00130469;
  goto LAB_0013007b;
LAB_00130490:
  ppVar5 = pppVar25[lVar18 + 1];
  lVar18 = lVar18 + 1;
  if (ppVar5 == (parasail_matrix_t *)0x0) {
    return (int)uVar17;
  }
  goto LAB_0012ff9d;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned long seq_count = 0;
    unsigned long limit = 0;
    parasail_sequences_t *sequences = NULL;
    char *endptr = NULL;
    char *filename = NULL;
    int c = 0;
    int test_scores = 1;
    char *matrixname = NULL;
    const parasail_matrix_t *matrix = NULL;
    gap_score_t gap = {INT_MIN,INT_MIN};
    int do_sse2 = 1;
    int do_sse41 = 1;
    int do_avx2 = 1;
    int do_altivec = 1;
    int do_neon = 1;
    int do_disp = 1;
    int do_nw = 1;
    int do_sg = 1;
    int do_sw = 1;

    while ((c = getopt(argc, argv, "f:m:n:o:e:vSi:E")) != -1) {
        switch (c) {
            case 'f':
                filename = optarg;
                break;
            case 'm':
                matrixname = optarg;
                break;
            case 'n':
                errno = 0;
                seq_count = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol");
                    exit(1);
                }
                break;
            case 'o':
                errno = 0;
                gap.open = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.open");
                    exit(1);
                }
                break;
            case 'e':
                errno = 0;
                gap.extend = strtol(optarg, &endptr, 10);
                if (errno) {
                    perror("strtol gap.extend");
                    exit(1);
                }
                break;
            case 'v':
                verbose = 1;
                break;
            case 'E':
                exit_on_mismatch = 1;
                break;
            case 'S':
                test_scores = 0;
                break;
            case 'i':
                do_sse2 = (NULL == strstr(optarg, "sse2"));
                do_sse41 = (NULL == strstr(optarg, "sse41"));
                do_avx2 = (NULL == strstr(optarg, "avx2"));
                do_altivec = (NULL == strstr(optarg, "altivec"));
                do_neon = (NULL == strstr(optarg, "neon"));
                do_disp = (NULL == strstr(optarg, "disp"));
                do_nw = (NULL == strstr(optarg, "nw"));
                do_sg = (NULL == strstr(optarg, "sg"));
                do_sw = (NULL == strstr(optarg, "sw"));
                break;
            case '?':
                if (optopt == 'f' || optopt == 'n') {
                    fprintf(stderr,
                            "Option -%c requires an argument.\n",
                            optopt);
                }
                else if (isprint(optopt)) {
                    fprintf(stderr, "Unknown option `-%c'.\n",
                            optopt);
                }
                else {
                    fprintf(stderr,
                            "Unknown option character `\\x%x'.\n",
                            optopt);
                }
                exit(1);
            default:
                fprintf(stderr, "default case in getopt\n");
                exit(1);
        }
    }

    if (filename) {
        sequences = parasail_sequences_from_file(filename);
        if (0 == seq_count) {
            seq_count = sequences->l;
        }
    }
    else {
        fprintf(stderr, "no filename specified\n");
        exit(1);
    }

    /* select the matrix */
    if (matrixname) {
        matrix = parasail_matrix_lookup(matrixname);
        if (NULL == matrix) {
            fprintf(stderr, "Specified substitution matrix not found.\n");
            exit(1);
        }
    }

    limit = binomial_coefficient(seq_count, 2);
    printf("%lu choose 2 is %lu\n", seq_count, limit);

#if HAVE_SSE2
    if (do_sse2 && parasail_can_use_sse2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_SSE41
    if (do_sse41 && parasail_can_use_sse41()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_sse41, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_sse41, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_sse41, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_AVX2
    if (do_avx2 && parasail_can_use_avx2()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_avx2, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_avx2, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_avx2, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_ALTIVEC
    if (do_altivec && parasail_can_use_altivec()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_altivec, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_altivec, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_altivec, sequences, limit, matrix, gap);
        }
    }
#endif

#if HAVE_NEON
    if (do_neon && parasail_can_use_neon()) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_neon, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_neon, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_neon, sequences, limit, matrix, gap);
        }
    }
#endif

    if (do_disp) {
        if (test_scores) {
            if (do_nw) check_functions(parasail_nw_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_dx_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qb_db_trace_disp, sequences, limit, matrix, gap);
            if (do_sg) check_functions(parasail_sg_qe_de_trace_disp, sequences, limit, matrix, gap);
            if (do_sw) check_functions(parasail_sw_trace_disp, sequences, limit, matrix, gap);
        }
    }

    parasail_sequences_free(sequences);

    return 0;
}